

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VScaleVectorArray_Serial(int nvec,realtype *c,N_Vector *X,N_Vector *Z)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  int in_EDI;
  realtype *zd;
  realtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar5;
  int local_4;
  
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    N_VScale_Serial((realtype)in_RCX,
                    (N_Vector)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (N_Vector)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_4 = 0;
  }
  else {
    iVar1 = **(int **)*in_RCX;
    if (in_RDX == in_RCX) {
      for (iVar5 = 0; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
        lVar2 = *(long *)(*(long *)in_RDX[iVar5] + 8);
        for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
          *(double *)(lVar2 + (long)iVar4 * 8) =
               *(double *)(in_RSI + (long)iVar5 * 8) * *(double *)(lVar2 + (long)iVar4 * 8);
        }
      }
      local_4 = 0;
    }
    else {
      for (iVar5 = 0; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
        lVar2 = *(long *)(*(long *)in_RDX[iVar5] + 8);
        lVar3 = *(long *)(*(long *)in_RCX[iVar5] + 8);
        for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
          *(double *)(lVar3 + (long)iVar4 * 8) =
               *(double *)(in_RSI + (long)iVar5 * 8) * *(double *)(lVar2 + (long)iVar4 * 8);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int N_VScaleVectorArray_Serial(int nvec, realtype* c, N_Vector* X, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VScale */
  if (nvec == 1) {
    N_VScale_Serial(c[0], X[0], Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[i] *= c[i]
   */
  if (X == Z) {
    for (i=0; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<N; j++) {
        xd[j] *= c[i];
      }
    }
    return(0);
  }

  /*
   * Z[i] = c[i] * X[i]
   */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c[i] * xd[j];
    }
  }
  return(0);
}